

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# windows.c
# Opt level: O2

void redraw_frame(void)

{
  gamewin *pgVar1;
  WINDOW *pWVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  gamewin **ppgVar6;
  
  if ((ui_flags.draw_frame != '\0') && (ui_flags.ingame != '\0')) {
    draw_frame();
    wnoutrefresh(basewin);
    iVar5 = -1;
    iVar3 = -1;
    if (mapwin != (WINDOW *)0x0) {
      iVar3 = mapwin->_maxy + 1;
    }
    wtouchln(mapwin,0,iVar3,1);
    if (msgwin != (WINDOW *)0x0) {
      iVar5 = msgwin->_maxy + 1;
    }
    wtouchln(msgwin,0,iVar5,1);
    wnoutrefresh(mapwin);
    wnoutrefresh(msgwin);
    if (statuswin != (WINDOW *)0x0) {
      wtouchln(statuswin,0,statuswin->_maxy + 1,1);
      wnoutrefresh(statuswin);
    }
    if (sidebar != (WINDOW *)0x0) {
      draw_sidebar_divider();
      if (sidebar == (WINDOW *)0x0) {
        uVar4 = 0xffffffffffffffff;
      }
      else {
        uVar4 = (ulong)((int)sidebar->_maxy + 1);
      }
      wtouchln(sidebar,0,uVar4,1);
      wnoutrefresh(sidebar);
    }
    ppgVar6 = &firstgw;
    while (pgVar1 = *ppgVar6, pgVar1 != (gamewin *)0x0) {
      pWVar2 = pgVar1->win;
      iVar5 = -1;
      if (pWVar2 != (WINDOW *)0x0) {
        iVar5 = pWVar2->_maxy + 1;
      }
      wtouchln(pWVar2,0,iVar5,1);
      wnoutrefresh(pgVar1->win);
      ppgVar6 = &pgVar1->next;
    }
  }
  return;
}

Assistant:

void redraw_frame(void)
{
    struct gamewin *gw;

    if (!ui_flags.draw_frame || !ui_flags.ingame)
	return;

    draw_frame();
    wnoutrefresh(basewin);

    /* The order of the following is based on redraw_game_windows(). */
    touchwin(mapwin);
    touchwin(msgwin);
    wnoutrefresh(mapwin);
    wnoutrefresh(msgwin);
    if (statuswin) {
	touchwin(statuswin);
	wnoutrefresh(statuswin);
    }
    if (sidebar) {
	draw_sidebar_divider();
	touchwin(sidebar);
	wnoutrefresh(sidebar);
    }

    for (gw = firstgw; gw; gw = gw->next) {
	touchwin(gw->win);
	wnoutrefresh(gw->win);
    }
}